

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraCodeLiteGenerator::CreateFoldersAndFiles
          (cmExtraCodeLiteGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,cmXMLWriter *xml,string *projectPath)

{
  cmExtraCodeLiteGenerator *pcVar1;
  cmExtraCodeLiteGenerator *pcVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_58;
  
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_58._M_impl.super__Rb_tree_header._M_header;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar1 = (cmExtraCodeLiteGenerator *)
           (cFiles->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pcVar2 = pcVar1,
        pcVar2 != (cmExtraCodeLiteGenerator *)&(cFiles->_M_t)._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&_Stack_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(pcVar2->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    pcVar1 = (cmExtraCodeLiteGenerator *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar2);
    this = pcVar2;
  }
  CreateFoldersAndFiles
            (this,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&_Stack_58,xml,projectPath);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&_Stack_58);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateFoldersAndFiles(
  std::map<std::string, cmSourceFile*>& cFiles, cmXMLWriter& xml,
  const std::string& projectPath)
{
  std::set<std::string> s;
  for (auto const& it : cFiles) {
    s.insert(it.first);
  }
  this->CreateFoldersAndFiles(s, xml, projectPath);
}